

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O0

void __thiscall
wasm::WasmBinaryWriter::WasmBinaryWriter
          (WasmBinaryWriter *this,Module *input,BufferWithRandomAccess *o,PassOptions *options)

{
  PassOptions *options_local;
  BufferWithRandomAccess *o_local;
  Module *input_local;
  WasmBinaryWriter *this_local;
  
  TableOfContents::TableOfContents(&this->tableOfContents);
  this->wasm = input;
  this->o = o;
  this->options = options;
  BinaryIndexes::BinaryIndexes(&this->indexes,input);
  ModuleUtils::IndexedHeapTypes::IndexedHeapTypes(&this->indexedTypes);
  std::
  unordered_map<wasm::Signature,_unsigned_int,_std::hash<wasm::Signature>,_std::equal_to<wasm::Signature>,_std::allocator<std::pair<const_wasm::Signature,_unsigned_int>_>_>
  ::unordered_map(&this->signatureIndexes);
  this->debugInfo = true;
  this->emitModuleName = true;
  this->sourceMap = (ostream *)0x0;
  std::__cxx11::string::string((string *)&this->sourceMapUrl);
  std::__cxx11::string::string((string *)&this->symbolMap);
  MixedArena::MixedArena(&this->allocator);
  std::
  vector<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>,_std::allocator<std::pair<unsigned_long,_const_wasm::Function::DebugLocation_*>_>_>
  ::vector(&this->sourceMapLocations);
  Function::DebugLocation::DebugLocation(&this->lastDebugLocation);
  std::unique_ptr<wasm::ImportInfo,std::default_delete<wasm::ImportInfo>>::
  unique_ptr<std::default_delete<wasm::ImportInfo>,void>
            ((unique_ptr<wasm::ImportInfo,std::default_delete<wasm::ImportInfo>> *)&this->importInfo
            );
  BinaryLocations::BinaryLocations(&this->binaryLocations);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&this->binaryLocationTrackedExpressionsForFunc);
  std::
  unordered_map<wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_map<std::pair<unsigned_int,_unsigned_int>,_unsigned_long,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>_>_>_>_>
  ::unordered_map(&this->funcMappedLocals);
  std::
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  ::unordered_map(&this->stringIndexes);
  ::wasm::WasmBinaryWriter::prepare();
  return;
}

Assistant:

WasmBinaryWriter(Module* input,
                   BufferWithRandomAccess& o,
                   const PassOptions& options)
    : wasm(input), o(o), options(options), indexes(*input) {
    prepare();
  }